

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::
InternalSwap(RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this,
            RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *other)

{
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *other_local;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }